

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__resample_vertical_scatter
               (stbir__info *stbir_info,stbir__per_split_info *split_info,int n0,int n1,
               float *vertical_coefficients,float *vertical_buffer,float *vertical_buffer_end)

{
  float *pfVar1;
  STBIR_VERTICAL_SCATTERFUNC **local_88;
  int local_80;
  int local_7c;
  int n;
  int i;
  float *outputs [8];
  int total;
  int k;
  float *vertical_buffer_local;
  float *vertical_coefficients_local;
  int n1_local;
  int n0_local;
  stbir__per_split_info *split_info_local;
  stbir__info *stbir_info_local;
  
  if ((stbir_info->vertical).is_gather != 0) {
    __assert_fail("!stbir_info->vertical.is_gather",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/stb_image_resize2.h"
                  ,0x18c7,
                  "void stbir__resample_vertical_scatter(const stbir__info *, stbir__per_split_info *, int, int, const float *, const float *, const float *)"
                 );
  }
  outputs[7]._4_4_ = 0;
  outputs[7]._0_4_ = (n1 - n0) + 1;
  if ((int)outputs[7] < 1) {
    __assert_fail("total > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/stb_image_resize2.h"
                  ,0x18cc,
                  "void stbir__resample_vertical_scatter(const stbir__info *, stbir__per_split_info *, int, int, const float *, const float *, const float *)"
                 );
  }
  do {
    local_80 = (int)outputs[7];
    if (8 < (int)outputs[7]) {
      local_80 = 8;
    }
    for (local_7c = 0; local_7c < local_80; local_7c = local_7c + 1) {
      pfVar1 = stbir__get_ring_buffer_scanline
                         (stbir_info,split_info,outputs[7]._4_4_ + local_7c + n0);
      *(float **)(&n + (long)local_7c * 2) = pfVar1;
      if ((local_7c != 0) && ((**(float **)(&n + (long)local_7c * 2) == 3e+38) != (*_n == 3e+38))) {
        local_80 = local_7c;
        break;
      }
    }
    if ((*_n != 3e+38) || (NAN(*_n))) {
      local_88 = stbir__vertical_scatter_blends;
    }
    else {
      local_88 = stbir__vertical_scatter_sets;
    }
    (*local_88[local_80 + -1])
              ((float **)&n,vertical_coefficients + outputs[7]._4_4_,vertical_buffer,
               vertical_buffer_end);
    outputs[7]._4_4_ = local_80 + outputs[7]._4_4_;
    outputs[7]._0_4_ = (int)outputs[7] - local_80;
    if ((int)outputs[7] == 0) {
      return;
    }
  } while( true );
}

Assistant:

static void stbir__resample_vertical_scatter(stbir__info const * stbir_info, stbir__per_split_info* split_info, int n0, int n1, float const * vertical_coefficients, float const * vertical_buffer, float const * vertical_buffer_end )
{
  STBIR_ASSERT( !stbir_info->vertical.is_gather );

  STBIR_PROFILE_START( vertical );
  {
    int k = 0, total = n1 - n0 + 1;
    STBIR_ASSERT( total > 0 );
    do {
      float * outputs[8];
      int i, n = total; if ( n > 8 ) n = 8;
      for( i = 0 ; i < n ; i++ )
      {
        outputs[ i ] = stbir__get_ring_buffer_scanline(stbir_info, split_info, k+i+n0 );
        if ( ( i ) && ( STBIR__FLOAT_BUFFER_IS_EMPTY( outputs[i] ) != STBIR__FLOAT_BUFFER_IS_EMPTY( outputs[0] ) ) ) // make sure runs are of the same type
        {
          n = i;
          break;
        }
      }
      // call the scatter to N scanlines at a time function (up to 8 scanlines of scattering at once)
      ((STBIR__FLOAT_BUFFER_IS_EMPTY( outputs[0] ))?stbir__vertical_scatter_sets:stbir__vertical_scatter_blends)[n-1]( outputs, vertical_coefficients + k, vertical_buffer, vertical_buffer_end );
      k += n;
      total -= n;
    } while ( total );
  }

  STBIR_PROFILE_END( vertical );
}